

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

void __thiscall Constructor::addOperand(Constructor *this,OperandSymbol *sym)

{
  string operstring;
  allocator local_41;
  value_type local_40;
  OperandSymbol *local_20;
  
  local_20 = sym;
  std::__cxx11::string::string((string *)&local_40,"\n ",&local_41);
  local_40._M_dataplus._M_p[1] =
       (char)((uint)(*(int *)&(this->operands).
                              super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->operands).
                             super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) + 'A';
  std::vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>::push_back
            (&this->operands,&local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->printpiece,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Constructor::addOperand(OperandSymbol *sym)

{
  string operstring = "\n ";	// Indicater character for operand
  operstring[1] = ('A'+operands.size()); // Encode index of operand
  operands.push_back(sym);
  printpiece.push_back(operstring); // Placeholder for operand's string
}